

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

void __thiscall
ktx::CommandCreate::determineTargetColorSpace
          (CommandCreate *this,ImageInput *in,ImageSpec *target,ColorSpaceInfo *colorSpaceInfo)

{
  char cVar1;
  khr_df_primaries_e kVar2;
  _Head_base<0UL,_const_TransferFunction_*,_false> _Var3;
  __uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> __p;
  __uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
  in_RAX;
  _khr_df_primaries_e *p_Var4;
  _khr_df_transfer_e *p_Var5;
  khr_df_primaries_e primaries;
  _Head_base<0UL,_const_ColorPrimaries_*,_false> _Var6;
  _Head_base<0UL,_const_ColorPrimaries_*,_false> local_28;
  
  local_28._M_head_impl =
       (ColorPrimaries *)
       in_RAX.
       super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
       super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
       super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
  determineSourceColorSpace(this,in,&colorSpaceInfo->src);
  primaries = (khr_df_primaries_e)in;
  kVar2 = (colorSpaceInfo->src).usedPrimaries;
  if ((this->options).super_OptionsCreate.convertPrimaries.
      super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_primaries_e>._M_engaged == true) {
    if (kVar2 == KHR_DF_PRIMARIES_UNSPECIFIED) {
      __assert_fail("colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED && \"determineSourceColorSpace failed to check for UNSPECIFIED.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                    ,0xad5,
                    "void ktx::CommandCreate::determineTargetColorSpace(const ImageInput &, ImageSpec &, ColorSpaceInfo &)"
                   );
    }
    p_Var4 = std::optional<_khr_df_primaries_e>::value
                       (&(this->options).super_OptionsCreate.convertPrimaries);
    (target->formatDesc).basic.field_0x1 = (char)*p_Var4;
    createColorPrimaries((CommandCreate *)&stack0xffffffffffffffd8,primaries);
    __p._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         local_28._M_head_impl;
    local_28._M_head_impl = (ColorPrimaries *)0x0;
    std::__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::reset
              ((__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
               &(colorSpaceInfo->dst).colorPrimaries,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
                        .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl);
    std::unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::~unique_ptr
              ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
               &stack0xffffffffffffffd8);
  }
  else {
    (target->formatDesc).basic.field_0x1 = (char)kVar2;
  }
  if ((this->options).super_OptionsCreate.assignTF.
      super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
    p_Var5 = std::optional<_khr_df_transfer_e>::value(&(this->options).super_OptionsCreate.assignTF)
    ;
    FormatDescriptor::setTransfer(&target->formatDesc,*p_Var5);
  }
  if ((this->options).super_OptionsCreate.convertTF.
      super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
    p_Var5 = std::optional<_khr_df_transfer_e>::value
                       (&(this->options).super_OptionsCreate.convertTF);
    FormatDescriptor::setTransfer(&target->formatDesc,*p_Var5);
  }
  cVar1 = (target->formatDesc).basic.field_0x2;
  if (cVar1 == '\x02') {
    std::make_unique<TransferFunctionSRGB>();
  }
  else {
    if (cVar1 != '\x01') {
      _Var6._M_head_impl =
           (ColorPrimaries *)
           (colorSpaceInfo->dst).transferFunction._M_t.
           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl;
      (colorSpaceInfo->dst).transferFunction._M_t.
      super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
      .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl = (TransferFunction *)0x0
      ;
      goto LAB_0014c0bc;
    }
    std::make_unique<TransferFunctionLinear>();
  }
  _Var6._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ColorPrimaries *)0x0;
  _Var3._M_head_impl =
       (colorSpaceInfo->dst).transferFunction._M_t.
       super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
       .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl;
  (colorSpaceInfo->dst).transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (TransferFunction *)_Var6._M_head_impl;
  if (_Var3._M_head_impl == (TransferFunction *)0x0) {
    return;
  }
  (*(_Var3._M_head_impl)->_vptr_TransferFunction[3])();
  _Var6._M_head_impl = local_28._M_head_impl;
LAB_0014c0bc:
  if (_Var6._M_head_impl != (ColorPrimaries *)0x0) {
    (*(*(_func_int ***)_Var6._M_head_impl)[3])();
  }
  return;
}

Assistant:

void CommandCreate::determineTargetColorSpace(const ImageInput& in, ImageSpec& target, ColorSpaceInfo& colorSpaceInfo) {
    // Primaries handling:
    //
    // 1. Use assign-primaries option value, if set.
    // 2. Use primaries info given by plugin.
    // 3. If no primaries info and input is PNG use PNG spec.
    //    recommendation of BT709/sRGB otherwise leave as
    //    UNSPECIFIED.
    // 4. If convert-primaries is specified but no primaries info is
    //    given by the plugin then fail.
    // 5. If convert-primaries is specified and primaries info determined
    //    above is different then set up conversion.

    determineSourceColorSpace(in, colorSpaceInfo.src);

    // Set Primaries

    // If convert-primaries is specified and primaries info determined
    // above is different then set up conversion.
    if (options.convertPrimaries.has_value()) {
        assert(colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED
               && "determineSourceColorSpace failed to check for UNSPECIFIED.");
        target.format().setPrimaries(options.convertPrimaries.value());
        // Okay to set this even if no conversion needed.
        colorSpaceInfo.dst.colorPrimaries = createColorPrimaries(target.format().primaries());
    } else {
        target.format().setPrimaries(colorSpaceInfo.src.usedPrimaries);
    }

    // target transfer is set from the --format value or --assignTF or --convertTF.
    if (options.assignTF.has_value())
        target.format().setTransfer(options.assignTF.value());

    if (options.convertTF.has_value())
        target.format().setTransfer(options.convertTF.value());

    switch (target.format().transfer()) {
    case KHR_DF_TRANSFER_LINEAR:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionLinear>();
        break;
    case KHR_DF_TRANSFER_SRGB:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionSRGB>();
        break;
    default:
        // Lack of will be handled if color transformation attempted.
        colorSpaceInfo.dst.transferFunction = nullptr;
    }
}